

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_light.cpp
# Opt level: O0

ON_3dVector * __thiscall
ON_Light::PerpindicularDirection(ON_3dVector *__return_storage_ptr__,ON_Light *this)

{
  bool bVar1;
  int iVar2;
  double *pdVar3;
  double dVar4;
  double *local_118;
  double *local_110;
  ON_3dVector local_d0;
  ON_3dVector local_b8;
  ON_3dVector local_a0;
  undefined1 local_88 [8];
  ON_3dVector ydir;
  double local_68;
  double local_60;
  ON_3dVector local_58;
  undefined1 local_40 [8];
  ON_3dVector xdir;
  ON_3dVector dir;
  ON_Light *this_local;
  
  xdir.z = (this->m_direction).x;
  bVar1 = ON_3dVector::IsValid((ON_3dVector *)&xdir.z);
  if ((bVar1) && (bVar1 = ON_3dVector::Unitize((ON_3dVector *)&xdir.z), bVar1)) {
    bVar1 = IsLinearLight(this);
    if ((bVar1) || (bVar1 = IsRectangularLight(this), bVar1)) {
      local_40 = (undefined1  [8])(this->m_length).x;
      xdir.x = (this->m_length).y;
      xdir.y = (this->m_length).z;
      bVar1 = ON_3dVector::IsValid((ON_3dVector *)local_40);
      if ((bVar1) &&
         ((bVar1 = ON_3dVector::Unitize((ON_3dVector *)local_40), bVar1 &&
          (dVar4 = ON_3dVector::operator*((ON_3dVector *)local_40,(ON_3dVector *)&xdir.z),
          ABS(dVar4) <= 1.490116119385e-08)))) {
        __return_storage_ptr__->x = (double)local_40;
        __return_storage_ptr__->y = xdir.x;
        __return_storage_ptr__->z = xdir.y;
        return __return_storage_ptr__;
      }
    }
    iVar2 = ON_3dVector::IsParallelTo
                      ((ON_3dVector *)&xdir.z,&ON_3dVector::ZAxis,0.05235987755982989);
    if (iVar2 == 0) {
      ON_CrossProduct((ON_3dVector *)&ydir.z,(ON_3dVector *)&xdir.z,&ON_3dVector::ZAxis);
      local_40 = (undefined1  [8])ydir.z;
      xdir.x = local_68;
      xdir.y = local_60;
    }
    else {
      ON_CrossProduct(&local_58,(ON_3dVector *)&xdir.z,&ON_3dVector::XAxis);
      local_40 = (undefined1  [8])local_58.x;
      xdir.x = local_58.y;
      xdir.y = local_58.z;
    }
    ON_3dVector::Unitize((ON_3dVector *)local_40);
    ON_CrossProduct((ON_3dVector *)local_88,(ON_3dVector *)&xdir.z,(ON_3dVector *)local_40);
    ON_3dVector::Unitize((ON_3dVector *)local_88);
    iVar2 = ON_3dVector::MaximumCoordinateIndex((ON_3dVector *)&xdir.z);
    if (iVar2 == 0) {
      if (ABS(xdir.x) <= ABS(ydir.x)) {
        local_110 = (double *)local_88;
      }
      else {
        local_110 = (double *)local_40;
      }
      __return_storage_ptr__->x = *local_110;
      __return_storage_ptr__->y = local_110[1];
      __return_storage_ptr__->z = local_110[2];
      if (__return_storage_ptr__->y <= 0.0 && __return_storage_ptr__->y != 0.0) {
        ON_3dVector::operator-(&local_a0,__return_storage_ptr__);
        __return_storage_ptr__->x = local_a0.x;
        __return_storage_ptr__->y = local_a0.y;
        __return_storage_ptr__->z = local_a0.z;
      }
    }
    else if (iVar2 - 1U < 2) {
      if (ABS((double)local_40) <= ABS((double)local_88)) {
        local_118 = (double *)local_88;
      }
      else {
        local_118 = (double *)local_40;
      }
      __return_storage_ptr__->x = *local_118;
      __return_storage_ptr__->y = local_118[1];
      __return_storage_ptr__->z = local_118[2];
      if (__return_storage_ptr__->x <= 0.0 && __return_storage_ptr__->x != 0.0) {
        ON_3dVector::operator-(&local_b8,__return_storage_ptr__);
        __return_storage_ptr__->x = local_b8.x;
        __return_storage_ptr__->y = local_b8.y;
        __return_storage_ptr__->z = local_b8.z;
      }
    }
    else {
      __return_storage_ptr__->x = (double)local_40;
      __return_storage_ptr__->y = xdir.x;
      __return_storage_ptr__->z = xdir.y;
    }
    iVar2 = ON_3dVector::MaximumCoordinateIndex(__return_storage_ptr__);
    pdVar3 = ON_3dVector::operator[](__return_storage_ptr__,iVar2);
    if (*pdVar3 <= 0.0 && *pdVar3 != 0.0) {
      ON_3dVector::operator-(&local_d0,__return_storage_ptr__);
      __return_storage_ptr__->x = local_d0.x;
      __return_storage_ptr__->y = local_d0.y;
      __return_storage_ptr__->z = local_d0.z;
    }
  }
  else {
    __return_storage_ptr__->x = ON_3dVector::UnsetVector.x;
    __return_storage_ptr__->y = ON_3dVector::UnsetVector.y;
    __return_storage_ptr__->z = ON_3dVector::UnsetVector.z;
  }
  return __return_storage_ptr__;
}

Assistant:

ON_3dVector ON_Light::PerpindicularDirection() const
{
  // returns a consistent vector perpendicular to the
  // light's direction.  This vector is useful for
  // user interface display.
  ON_3dVector dir = m_direction;
  if ( !dir.IsValid() || !dir.Unitize() )
    return ON_3dVector::UnsetVector;

  ON_3dVector xdir;
  if ( IsLinearLight() || IsRectangularLight() )
  {
    xdir = m_length;
    if ( xdir.IsValid() && xdir.Unitize() && fabs(xdir*dir) <= ON_SQRT_EPSILON )
      return xdir;
  }

  if( dir.IsParallelTo( ON_3dVector::ZAxis, ON_DEGREES_TO_RADIANS * 3.0))
    xdir = ON_CrossProduct( dir, ON_3dVector::XAxis);
  else
    xdir = ON_CrossProduct( dir, ON_3dVector::ZAxis);
  xdir.Unitize();
  ON_3dVector ydir = ON_CrossProduct(dir,xdir);
  ydir.Unitize();
  ON_3dVector right;

  switch(dir.MaximumCoordinateIndex())
  {
  case 0:
    right = (fabs(xdir.y) > fabs(ydir.y)) ? xdir : ydir;
    if (right.y < 0.0)
      right = -right;
    break;
  case 1:
  case 2:
    right = (fabs(xdir.x) > fabs(ydir.x)) ? xdir : ydir;
    if (right.x < 0.0)
      right = -right;
    break;
  default:
    right = xdir;
    break;
  }

  if (right[right.MaximumCoordinateIndex()] < 0.0)
    right = -right;

  return right;  
}